

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems
          (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__return_storage_ptr__,Tensor *this)

{
  uint uVar1;
  uint b;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 local_a8 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_78;
  uint local_58 [2];
  uint auStack_50 [2];
  uint auStack_48 [6];
  
  uVar2 = (ulong)(this->d).bd;
  if (uVar2 == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,1,this,(allocator_type *)local_a8);
  }
  else {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,uVar2,(allocator_type *)local_a8);
    uVar1 = Dim::batch_size(&this->d);
    local_58 = *(uint (*) [2])(this->d).d;
    auStack_50 = *(uint (*) [2])((this->d).d + 2);
    auStack_48._0_8_ = *(undefined8 *)((this->d).d + 4);
    auStack_48._8_8_ = *(undefined8 *)((this->d).d + 6);
    lVar3 = 0;
    uVar4 = 0;
    for (uVar2 = 0; uVar2 < (this->d).bd; uVar2 = uVar2 + 1) {
      local_a8._40_8_ = this->v + uVar4;
      local_a8._0_4_ = local_58[0];
      local_a8._4_4_ = local_58[1];
      local_a8._8_4_ = auStack_50[0];
      local_a8._12_4_ = auStack_50[1];
      local_a8._16_4_ = auStack_48[0];
      local_a8._20_4_ = auStack_48[1];
      local_a8._24_4_ = auStack_48[2];
      local_a8._28_4_ = auStack_48[3];
      local_a8._32_4_ = 1;
      local_78.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
      operator=((Tensor *)
                ((long)(((__return_storage_ptr__->
                         super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                         super__Vector_impl_data._M_start)->d).d + lVar3),(Tensor *)local_a8);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78);
      uVar4 = (ulong)((int)uVar4 + uVar1);
      lVar3 = lVar3 + 0x48;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }